

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264StreamReader.cpp
# Opt level: O2

int __thiscall
H264StreamReader::writeSEIMessage
          (H264StreamReader *this,uint8_t *dstBuffer,uint8_t *dstEnd,SEIUnit *sei,
          uint8_t payloadType)

{
  bool bVar1;
  byte *pbVar2;
  SPSUnit *sps;
  const_iterator cVar3;
  undefined4 *puVar4;
  int iVar5;
  const_iterator __begin3;
  byte *pbVar6;
  uint8_t *puVar7;
  BitStreamWriter writer;
  char *local_308;
  uint *local_2f0;
  undefined8 local_2e8;
  uint local_2e0;
  undefined4 uStack_2dc;
  undefined4 uStack_2d8;
  undefined4 uStack_2d4;
  uint *local_2d0;
  undefined8 local_2c8;
  uint local_2c0;
  undefined4 uStack_2bc;
  undefined4 uStack_2b8;
  undefined4 uStack_2b4;
  ostringstream ss;
  uint8_t tmpBuffer [256];
  uint8_t local_38 [8];
  
  if ((long)dstEnd - (long)dstBuffer < 4) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    std::operator<<((ostream *)&ss,"H264 stream error: Not enough buffer for write headers");
    puVar4 = (undefined4 *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    *puVar4 = 3;
    *(undefined4 **)(puVar4 + 2) = puVar4 + 6;
    if (local_2d0 == &local_2c0) {
      puVar4[6] = local_2c0;
      puVar4[7] = uStack_2bc;
      puVar4[8] = uStack_2b8;
      puVar4[9] = uStack_2b4;
    }
    else {
      *(uint **)(puVar4 + 2) = local_2d0;
      *(ulong *)(puVar4 + 6) = CONCAT44(uStack_2bc,local_2c0);
    }
    *(undefined8 *)(puVar4 + 4) = local_2c8;
    local_2c8 = 0;
    local_2c0 = local_2c0 & 0xffffff00;
    local_2d0 = &local_2c0;
    __cxa_throw(puVar4,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  writer.super_BitStream.m_totalBits = 0;
  writer.m_curVal = 0;
  writer.m_bitWrited = 0;
  writer.super_BitStream.m_buffer = (uint *)0x0;
  writer.super_BitStream.m_initBuffer = (uint *)0x0;
  puVar7 = dstBuffer;
  if ((this->super_MPEGStreamReader).m_shortStartCodes == false) {
    puVar7 = dstBuffer + 1;
    *dstBuffer = '\0';
  }
  puVar7[0] = '\0';
  puVar7[1] = '\0';
  puVar7[2] = '\x01';
  BitStreamWriter::setBuffer(&writer,tmpBuffer,local_38);
  bVar1 = this->m_mvcSubStream;
  BitStreamWriter::putBits(&writer,8,6);
  if (bVar1 == true) {
    BitStreamWriter::putBits(&writer,8,0x25);
    local_308 = (char *)((long)((int)(((int)writer.super_BitStream.m_buffer -
                                      (int)writer.super_BitStream.m_initBuffer) * 8 +
                                     writer.m_bitWrited) / 8) +
                        (long)writer.super_BitStream.m_initBuffer);
    BitStreamWriter::putBits(&writer,8,0);
    iVar5 = ((int)writer.super_BitStream.m_initBuffer - (int)writer.super_BitStream.m_buffer) * 8 -
            writer.m_bitWrited;
    pbVar6 = (this->m_lastSeiMvcHeader).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pbVar2 = (this->m_lastSeiMvcHeader).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pbVar6 == pbVar2) {
      BitStreamWriter::putBits(&writer,8,0xc0);
      BitStreamWriter::putBits(&writer,8,0x10);
    }
    else {
      for (; pbVar6 != pbVar2; pbVar6 = pbVar6 + 1) {
        BitStreamWriter::putBits(&writer,8,(uint)*pbVar6);
      }
    }
  }
  else {
    iVar5 = 0;
    local_308 = (char *)0x0;
  }
  puVar7 = puVar7 + 3;
  BitStreamWriter::putBits(&writer,8,(uint)payloadType);
  cVar3 = std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_SPSUnit_*>,_std::_Select1st<std::pair<const_unsigned_int,_SPSUnit_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SPSUnit_*>_>_>
          ::find(&(this->m_spsMap)._M_t,&this->m_lastSliceSPS);
  sps = (SPSUnit *)cVar3._M_node[1]._M_parent;
  if (sps != (SPSUnit *)0x0) {
    if (payloadType == '\0') {
      SEIUnit::serialize_buffering_period_message(sei,sps,&writer,false);
    }
    else {
      SEIUnit::serialize_pic_timing_message(sei,sps,&writer,false);
    }
    if (local_308 != (char *)0x0) {
      *local_308 = (char)(iVar5 + writer.m_bitWrited >> 3) +
                   ((char)writer.super_BitStream.m_buffer -
                   (char)writer.super_BitStream.m_initBuffer);
    }
    NALUnit::write_rbsp_trailing_bits(&writer);
    BitStreamWriter::flushBits(&writer);
    iVar5 = NALUnit::encodeNAL(tmpBuffer,
                               tmpBuffer +
                               (int)(((int)writer.super_BitStream.m_buffer -
                                     (int)writer.super_BitStream.m_initBuffer) * 8 +
                                    writer.m_bitWrited) / 8,puVar7,(long)dstEnd - (long)puVar7);
    if (iVar5 == -1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
      std::operator<<((ostream *)&ss,"H264 stream error: Not enough buffer for write headers");
      puVar4 = (undefined4 *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      *puVar4 = 3;
      *(undefined4 **)(puVar4 + 2) = puVar4 + 6;
      if (local_2f0 == &local_2e0) {
        puVar4[6] = local_2e0;
        puVar4[7] = uStack_2dc;
        puVar4[8] = uStack_2d8;
        puVar4[9] = uStack_2d4;
      }
      else {
        *(uint **)(puVar4 + 2) = local_2f0;
        *(ulong *)(puVar4 + 6) = CONCAT44(uStack_2dc,local_2e0);
      }
      *(undefined8 *)(puVar4 + 4) = local_2e8;
      local_2e0 = local_2e0 & 0xffffff00;
      __cxa_throw(puVar4,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
    }
    puVar7 = puVar7 + iVar5;
  }
  return (int)puVar7 - (int)dstBuffer;
}

Assistant:

int H264StreamReader::writeSEIMessage(uint8_t *dstBuffer, const uint8_t *dstEnd, const SEIUnit &sei,
                                      const uint8_t payloadType) const
{
    uint8_t *curPos = dstBuffer;

    if (dstEnd - curPos < 4)
        THROW(ERR_COMMON, "H264 stream error: Not enough buffer for write headers")

    uint8_t tmpBuffer[256];
    BitStreamWriter writer{};
    curPos = writeNalPrefix(curPos);
    writer.setBuffer(tmpBuffer, tmpBuffer + sizeof(tmpBuffer));

    uint8_t *sizeField = nullptr;
    unsigned beforeMessageLen = 0;
    if (m_mvcSubStream)
    {
        writer.putBits(8, static_cast<int>(NALUnit::NALType::nuSEI));
        writer.putBits(8, SEI_MSG_MVC_SCALABLE_NESTING);

        sizeField = writer.getBuffer() + writer.getBitsCount() / 8;
        writer.putBits(8, 0);  // skip size field
        beforeMessageLen = writer.getBitsCount();

        static constexpr uint8_t DEFAULT_MVC_SEI_HEADER[] = {192, 16};
        if (!m_lastSeiMvcHeader.empty())
        {
            for (const auto &i : m_lastSeiMvcHeader) writer.putBits(8, i);
        }
        else
        {
            writer.putBits(8, DEFAULT_MVC_SEI_HEADER[0]);
            writer.putBits(8, DEFAULT_MVC_SEI_HEADER[1]);
        }

        writer.putBits(8, payloadType);
    }
    else
    {
        writer.putBits(8, static_cast<int>(NALUnit::NALType::nuSEI));
        writer.putBits(8, payloadType);
    }

    const SPSUnit *sps = m_spsMap.find(m_lastSliceSPS)->second;
    if (sps)
    {
        if (payloadType == 0)
            sei.serialize_buffering_period_message(*sps, writer, false);

        else
            sei.serialize_pic_timing_message(*sps, writer, false);

        if (sizeField)
        {
            const unsigned msgLen = writer.getBitsCount() - beforeMessageLen;
            *sizeField = static_cast<uint8_t>(msgLen / 8);
        }
        SEIUnit::write_rbsp_trailing_bits(writer);
        writer.flushBits();

        const int sRez = SEIUnit::encodeNAL(tmpBuffer, tmpBuffer + writer.getBitsCount() / 8, curPos, dstEnd - curPos);
        if (sRez == -1)
            THROW(ERR_COMMON, "H264 stream error: Not enough buffer for write headers")
        curPos += sRez;
    }

    return static_cast<int>(curPos - dstBuffer);
}